

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

void __thiscall
Test::Suite::testFailed
          (Suite *this,char *fileName,uint32_t lineNumber,string *errorMessage,string *userMessage)

{
  bool bVar1;
  AssertionFailedException *this_00;
  Assertion local_f8;
  string *local_30;
  string *userMessage_local;
  string *errorMessage_local;
  char *pcStack_18;
  uint32_t lineNumber_local;
  char *fileName_local;
  Suite *this_local;
  
  local_30 = userMessage;
  userMessage_local = errorMessage;
  errorMessage_local._4_4_ = lineNumber;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  Assertion::Assertion(&local_f8,fileName,lineNumber,errorMessage,userMessage);
  testFailed(this,&local_f8);
  Assertion::~Assertion(&local_f8);
  bVar1 = continueAfterFailure(this);
  if (!bVar1) {
    this_00 = (AssertionFailedException *)__cxa_allocate_exception(0x10);
    AssertionFailedException::AssertionFailedException(this_00);
    __cxa_throw(this_00,&AssertionFailedException::typeinfo,
                AssertionFailedException::~AssertionFailedException);
  }
  return;
}

Assistant:

void Suite::testFailed(
    const char *fileName, uint32_t lineNumber, std::string &&errorMessage, const std::string &userMessage) {
  testFailed(Assertion(fileName, lineNumber, errorMessage, userMessage));
  if (!continueAfterFailure())
    throw AssertionFailedException{};
}